

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O1

double __thiscall soul::WaveGenerators::Square::getSample(Square *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = (this->super_Blep).super_Generator.phaseIncrement;
  dVar1 = (this->super_Blep).super_Generator.currentPhase;
  if (dVar3 <= dVar1) {
    dVar5 = 0.0;
    if (1.0 - dVar3 < dVar1) {
      dVar3 = (dVar1 + -1.0) / dVar3;
      dVar5 = dVar3 * dVar3 + dVar3 + dVar3 + 1.0;
    }
  }
  else {
    dVar3 = dVar1 / dVar3;
    dVar5 = ((dVar3 + dVar3) - dVar3 * dVar3) + -1.0;
  }
  dVar2 = fmod(dVar1 + 0.5,1.0);
  dVar3 = (this->super_Blep).super_Generator.phaseIncrement;
  if (dVar3 <= dVar2) {
    dVar4 = 0.0;
    if (1.0 - dVar3 < dVar2) {
      dVar3 = (dVar2 + -1.0) / dVar3;
      dVar4 = dVar3 * dVar3 + dVar3 + dVar3 + 1.0;
    }
  }
  else {
    dVar2 = dVar2 / dVar3;
    dVar4 = ((dVar2 + dVar2) - dVar2 * dVar2) + -1.0;
  }
  return (*(double *)(&DAT_00260110 + (ulong)(dVar1 < 0.5) * 8) - dVar5) + dVar4;
}

Assistant:

double getSample() override
        {
            return (currentPhase < 0.5 ? -1.0f : 1.0f) - blep (currentPhase)
                    + blep (std::fmod (currentPhase + 0.5, 1.0));
        }